

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::Canceler::AdapterBase::~AdapterBase(AdapterBase *this)

{
  char *in_RSI;
  
  this->_vptr_AdapterBase = (_func_int **)&PTR___cxa_pure_virtual_00672c80;
  unlink(this,in_RSI);
  return;
}

Assistant:

Canceler::AdapterBase::~AdapterBase() noexcept(false) {
  unlink();
}